

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int renameUnmapExprCb(Walker *pWalker,Expr *pExpr)

{
  Parse *pPVar1;
  RenameToken *pRVar2;
  
  pPVar1 = pWalker->pParse;
  pRVar2 = pPVar1->pRename;
  do {
    if (pRVar2 == (RenameToken *)0x0) {
LAB_00192a83:
      if (((pExpr->flags & 0x3000000) == 0) &&
         (pRVar2 = pPVar1->pRename, pRVar2 != (RenameToken *)0x0)) {
        do {
          if ((anon_union_8_3_c79b3df9_for_y *)pRVar2->p == &pExpr->y) {
            pRVar2->p = (void *)0x0;
            return 0;
          }
          pRVar2 = pRVar2->pNext;
        } while (pRVar2 != (RenameToken *)0x0);
      }
      return 0;
    }
    if ((Expr *)pRVar2->p == pExpr) {
      pRVar2->p = (void *)0x0;
      goto LAB_00192a83;
    }
    pRVar2 = pRVar2->pNext;
  } while( true );
}

Assistant:

static int renameUnmapExprCb(Walker *pWalker, Expr *pExpr){
  Parse *pParse = pWalker->pParse;
  sqlite3RenameTokenRemap(pParse, 0, (const void*)pExpr);
  if( ExprUseYTab(pExpr) ){
    sqlite3RenameTokenRemap(pParse, 0, (const void*)&pExpr->y.pTab);
  }
  return WRC_Continue;
}